

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus_test.cpp
# Opt level: O2

void __thiscall crnlib::corpus_tester::corpus_tester(corpus_tester *this)

{
  color_quad<unsigned_char,_int> local_14;
  
  (this->m_bad_block_img).m_width = 0;
  (this->m_bad_block_img).m_height = 0;
  (this->m_bad_block_img).m_pitch = 0;
  (this->m_bad_block_img).m_total = 0;
  (this->m_bad_block_img).m_comp_flags = 0xf;
  (this->m_bad_block_img).m_pixel_buf.m_size = 0;
  (this->m_bad_block_img).m_pixel_buf.m_capacity = 0;
  (this->m_bad_block_img).m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
  (this->m_bad_block_img).m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
  image<crnlib::color_quad<unsigned_char,_int>_>::resize
            (&this->m_bad_block_img,0x100,0x100,0xffffffff,&local_14);
  this->m_next_bad_block_index = 0;
  this->m_total_bad_block_files = 0;
  return;
}

Assistant:

corpus_tester::corpus_tester() {
  m_bad_block_img.resize(256, 256);
  m_next_bad_block_index = 0;
  m_total_bad_block_files = 0;
}